

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

int nonce_function_dleq(uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16)

{
  int iVar1;
  undefined1 local_98 [8];
  secp256k1_sha256 sha;
  uchar *algo16_local;
  uchar *key32_local;
  uchar *msg32_local;
  uchar *nonce32_local;
  
  if (algo16 != (uchar *)0x0) {
    sha.bytes = (size_t)algo16;
    iVar1 = algo16_len(algo16);
    secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_98,algo16,(long)iVar1);
    secp256k1_sha256_write((secp256k1_sha256 *)local_98,key32,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)local_98,msg32,0x20);
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_98,nonce32);
  }
  nonce32_local._4_4_ = (uint)(algo16 != (uchar *)0x0);
  return nonce32_local._4_4_;
}

Assistant:

static int nonce_function_dleq(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16) {
    secp256k1_sha256 sha;

    if (algo16 == NULL) {
        return 0;
    }
    secp256k1_sha256_initialize_tagged(&sha, algo16, algo16_len(algo16));
    secp256k1_sha256_write(&sha, key32, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}